

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O1

bool __thiscall
WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
          (WriterTestHelper<unsigned_char,_3U,_32849U> *this,ktx_uint8_t *pData)

{
  pointer pvVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ktx_uint32_t kVar7;
  pointer pvVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  void *pvVar21;
  ulong uVar22;
  long lVar23;
  ktx_uint32_t faceSlice;
  ulong uVar24;
  ulong uVar25;
  size_t __n;
  
  uVar3 = this->numLevels;
  if ((ulong)uVar3 == 0) {
    return true;
  }
  uVar4 = this->width;
  uVar5 = this->height;
  uVar6 = this->depth;
  uVar19 = (ulong)this->numLayers;
  kVar7 = this->numFaces;
  pvVar8 = (this->images).
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar2 = this->isArray;
  uVar18 = 0;
  do {
    bVar16 = (byte)uVar18;
    uVar11 = uVar4 >> (bVar16 & 0x1f);
    __n = (ulong)uVar11 * 3;
    if (uVar11 == 0) {
      __n = 3;
    }
    uVar12 = uVar5 >> (bVar16 & 0x1f);
    uVar13 = uVar12 + (uVar12 == 0);
    uVar11 = uVar6 >> (bVar16 & 0x1f);
    uVar11 = uVar11 + (uVar11 == 0);
    uVar20 = (int)__n - 1U & 3;
    lVar23 = (uVar20 ^ 3) + __n;
    uVar15 = (ulong)uVar13 * lVar23;
    if (kVar7 == 6) {
      uVar11 = 6;
    }
    uVar24 = (ulong)uVar11;
    uVar22 = uVar24 * uVar19 * uVar15;
    if (kVar7 == 6 && (bVar2 & 1U) == 0) {
      uVar22 = uVar15;
    }
    if (uVar22 == *(uint *)pData) {
      pData = (ktx_uint8_t *)((long)pData + 4);
      iVar14 = 5;
      if (uVar19 != 0) {
        pvVar1 = pvVar8 + uVar18;
        if (kVar7 == 6 && (bVar2 & 1U) == 0) {
          uVar24 = 6;
        }
        uVar22 = 0;
        do {
          uVar25 = 0;
          do {
            if (uVar20 == 3) {
              lVar9 = *(long *)(*(long *)&(pvVar1->
                                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                          )._M_impl.super__Vector_impl_data + uVar22 * 0x18);
              pvVar21 = *(void **)(lVar9 + uVar25 * 0x18);
              iVar14 = bcmp(pvVar21,pData,*(long *)(lVar9 + 8 + uVar25 * 0x18) - (long)pvVar21);
              if (iVar14 != 0) {
                iVar14 = 1;
                goto LAB_001419b0;
              }
              pData = (ktx_uint8_t *)((long)pData + uVar15);
            }
            else {
              pvVar21 = *(void **)(*(long *)(*(long *)&(pvVar1->
                                                  super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data + uVar22 * 0x18)
                                  + uVar25 * 0x18);
              iVar14 = bcmp(pvVar21,pData,__n);
              if (iVar14 == 0) {
                uVar11 = 1;
                do {
                  uVar17 = uVar11;
                  pData = (ktx_uint8_t *)((long)pData + lVar23);
                  pvVar21 = (void *)((long)pvVar21 + __n);
                  if (uVar13 == uVar17) {
                    iVar14 = 0;
                    goto LAB_00141983;
                  }
                  iVar14 = bcmp(pvVar21,pData,__n);
                  uVar11 = uVar17 + 1;
                } while (iVar14 == 0);
                iVar14 = 1;
LAB_00141983:
                bVar10 = uVar17 < uVar12;
              }
              else {
                iVar14 = 1;
                bVar10 = true;
              }
              if (bVar10) goto LAB_001419b0;
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar24);
          iVar14 = 8;
LAB_001419b0:
          if (iVar14 != 8) goto LAB_00141a22;
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar19);
        iVar14 = 5;
      }
LAB_00141a22:
      if (iVar14 == 5) {
        iVar14 = 0;
      }
    }
    else {
      iVar14 = 1;
    }
    if (iVar14 != 0) goto LAB_00141a46;
    uVar18 = uVar18 + 1;
  } while (uVar18 != uVar3);
  iVar14 = 2;
LAB_00141a46:
  return iVar14 == 2;
}

Assistant:

bool compareRawImages(ktx_uint8_t* pData) {
        for (ktx_uint32_t level = 0; level < numLevels; level++) {
            ktx_uint32_t faceLodSize = *(ktx_uint32_t*)pData;
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t levelDepth = MAX(1, depth >> level);
            ktx_uint32_t numImages;
            ktx_uint32_t rowPadding;
            ktx_size_t paddedImageBytes;
            ktx_size_t paddedRowBytes, rowBytes;
            ktx_size_t expectedFaceLodSize;

            rowBytes = levelWidth
                            * sizeof(component_type)
                            * numComponents;
            rowPadding = 3 - ((rowBytes + KTX_GL_UNPACK_ALIGNMENT-1) % KTX_GL_UNPACK_ALIGNMENT);
            paddedRowBytes = rowBytes + rowPadding;
            paddedImageBytes = paddedRowBytes * levelHeight;
            if (numFaces == 6 && !isArray) {
                // Non-array cubemap.
                numImages = numFaces;
                expectedFaceLodSize = paddedImageBytes;
            } else {
                numImages = numFaces == 6 ? numFaces : levelDepth;
                expectedFaceLodSize = paddedImageBytes * numImages * numLayers;
            }
            if (faceLodSize != expectedFaceLodSize)
               return false;
            pData += sizeof(ktx_uint32_t);
            for (ktx_uint32_t layer = 0; layer < numLayers; layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < numImages; faceSlice++) {
                    if (rowPadding == 0) {
                        if (memcmp(images[level][layer][faceSlice].data(),
                                   pData,
                                   images[level][layer][faceSlice].size() * sizeof(component_type)))
                            return false;
                        pData += paddedImageBytes;
                    } else {
                        ktx_uint8_t* pImage = (ktx_uint8_t*)images[level][layer][faceSlice].data();
                        for (ktx_uint32_t row = 0; row < levelHeight; row++) {
                            if (memcmp(pImage, pData, rowBytes))
                                return false;
                            pImage += rowBytes;
                            pData += paddedRowBytes;
                        }
                    }
                }
            }
        }
        return true;
    }